

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack4_8(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar5 [32];
  
  uVar1 = *in;
  auVar4._4_4_ = uVar1;
  auVar4._0_4_ = uVar1;
  auVar4._8_4_ = uVar1;
  auVar4._12_4_ = uVar1;
  auVar5._16_4_ = uVar1;
  auVar5._0_16_ = auVar4;
  auVar5._20_4_ = uVar1;
  auVar5._24_4_ = uVar1;
  auVar5._28_4_ = uVar1;
  auVar2 = vpsrlvd_avx2(auVar4,_DAT_001a61f0);
  auVar3 = valignd_avx512vl(ZEXT1632(auVar2),ZEXT1632(auVar2),7);
  auVar3 = vpblendd_avx2(auVar3,auVar5,1);
  auVar2 = vpsrlvd_avx2(auVar4,_DAT_001aa310);
  auVar7._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar4;
  auVar7._16_16_ = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar2;
  auVar3 = vpblendd_avx2(auVar3,auVar7,0x60);
  auVar6._8_4_ = 0xf;
  auVar6._0_8_ = 0xf0000000f;
  auVar6._12_4_ = 0xf;
  auVar6._16_4_ = 0xf;
  auVar6._20_4_ = 0xf;
  auVar6._24_4_ = 0xf;
  auVar6._28_4_ = 0xf;
  auVar3 = vpandd_avx512vl(auVar3,auVar6);
  auVar6 = vpsrld_avx2(auVar5,0x1c);
  auVar3 = vpblendd_avx2(auVar3,auVar6,0x80);
  *(undefined1 (*) [32])out = auVar3;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack4_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 4);
  out++;
  *out = ((*in) >> 4) % (1U << 4);
  out++;
  *out = ((*in) >> 8) % (1U << 4);
  out++;
  *out = ((*in) >> 12) % (1U << 4);
  out++;
  *out = ((*in) >> 16) % (1U << 4);
  out++;
  *out = ((*in) >> 20) % (1U << 4);
  out++;
  *out = ((*in) >> 24) % (1U << 4);
  out++;
  *out = ((*in) >> 28);
  ++in;
  out++;

  return in;
}